

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

void __thiscall tf::Graph::_clear_detached(Graph *this)

{
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> _Var1;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> itr;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> _Var2;
  
  _Var1 = std::
          __partition<__gnu_cxx::__normal_iterator<tf::Node**,std::vector<tf::Node*,std::allocator<tf::Node*>>>,tf::Graph::_clear_detached()::_lambda(tf::Node*)_1_>
                    ((this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  for (_Var2 = _Var1;
      _Var2._M_current !=
      (this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish; _Var2._M_current = _Var2._M_current + 1) {
    ObjectPool<tf::Node,_65536UL>::recycle
              ((ObjectPool<tf::Node,_65536UL> *)node_pool,*_Var2._M_current);
  }
  std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::resize
            (&this->_nodes,
             (long)_Var1._M_current -
             (long)(this->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

inline void Graph::_clear_detached() {

  auto mid = std::partition(_nodes.begin(), _nodes.end(), [] (Node* node) {
    return !(node->_state.load(std::memory_order_relaxed) & Node::DETACHED);
  });

  for(auto itr = mid; itr != _nodes.end(); ++itr) {
    node_pool.recycle(*itr);
  }
  _nodes.resize(std::distance(_nodes.begin(), mid));
}